

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int omac_acpkm_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  size_t *in_RSI;
  uchar *in_RDI;
  int ret;
  size_t mac_size;
  uchar mac [16];
  OMAC_ACPKM_CTX *c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_38 [24];
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  local_20 = EVP_MD_CTX_get0_md_data(in_RDI);
  if (*(int *)(local_20 + 0x18) == 0) {
    ERR_GOST_error(0,0x10,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    iVar1 = 0;
  }
  else {
    iVar1 = CMAC_ACPKM_Final((CMAC_ACPKM_CTX *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             in_RSI);
    memcpy(in_RSI,local_38,*(size_t *)(local_20 + 8));
  }
  return iVar1;
}

Assistant:

int omac_acpkm_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    unsigned char mac[MAX_GOST_OMAC_ACPKM_SIZE];
    size_t mac_size = sizeof(mac);
    int ret;

    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    ret = CMAC_ACPKM_Final(c->cmac_ctx, mac, &mac_size);

    memcpy(md, mac, c->dgst_size);
    return ret;
}